

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.h
# Opt level: O1

string * FastRegExp::Unicode::toString<char32_t>(string *__return_storage_ptr__,char32_t *v)

{
  char32_t local_78 [2];
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  local_70;
  
  local_70._M_cvt._M_t.
  super___uniq_ptr_impl<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
  .
  super__Head_base<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>,_true,_true>
        )operator_new(0x10);
  *(undefined8 *)
   local_70._M_cvt._M_t.
   super___uniq_ptr_impl<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
   .
   super__Head_base<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_false>
   ._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_70._M_cvt._M_t.
          super___uniq_ptr_impl<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
          .
          super__Head_base<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_false>
          ._M_head_impl + 8) = 0;
  *(undefined4 *)
   ((long)local_70._M_cvt._M_t.
          super___uniq_ptr_impl<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
          .
          super__Head_base<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_false>
          ._M_head_impl + 8) = 0;
  *(undefined ***)
   local_70._M_cvt._M_t.
   super___uniq_ptr_impl<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_std::default_delete<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_>_>
   .
   super__Head_base<0UL,_FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>_*,_false>
   ._M_head_impl = &PTR__codecvt_00110a90;
  local_70._M_byte_err_string._M_dataplus._M_p = (pointer)&local_70._M_byte_err_string.field_2;
  local_70._M_byte_err_string._M_string_length = 0;
  local_70._M_byte_err_string.field_2._M_local_buf[0] = '\0';
  local_70._M_wide_err_string._M_dataplus._M_p = (pointer)&local_70._M_wide_err_string.field_2;
  local_70._M_wide_err_string._M_string_length = 0;
  local_70._M_wide_err_string.field_2._M_local_buf[0] = L'\0';
  local_70._M_state.__count = 0;
  local_70._M_state.__value = (anon_union_4_2_91654ee9_for___value)0x0;
  local_70._M_count = 0;
  local_70._M_with_cvtstate = false;
  local_70._M_with_strings = false;
  local_78[0] = *v;
  local_78[1] = 0;
  std::__cxx11::
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,&local_70,local_78,local_78 + 1);
  std::__cxx11::
  wstring_convert<FastRegExp::Unicode::DeletableFacet<std::codecvt<char32_t,_char,___mbstate_t>_>,_char32_t,_std::allocator<char32_t>,_std::allocator<char>_>
  ::~wstring_convert(&local_70);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string toString(const T &v)
{
    return std::wstring_convert<
        DeletableFacet<
            std::codecvt<
                char32_t,
                char,
                std::mbstate_t
            >
        >,
        char32_t
    >().to_bytes(v);
}